

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O3

void printBounds(Settings *s)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bounds:\n\t",9);
  poVar1 = std::ostream::_M_insert<double>(s->minx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," <= x <= ",9);
  poVar1 = std::ostream::_M_insert<double>(s->maxx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  poVar1 = std::ostream::_M_insert<double>(s->miny);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," <= y <= ",9);
  poVar1 = std::ostream::_M_insert<double>(s->maxy);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void printBounds(const Settings& s)
{
	std::cout << "Bounds:\n\t"
			<< s.minx << " <= x <= " << s.maxx
			<< "\n\t"
			<< s.miny << " <= y <= " << s.maxy
			<< std::endl;
}